

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSampleVerifier.cpp
# Opt level: O2

bool __thiscall
vkt::texture::SampleVerifier::verifySampleImpl
          (SampleVerifier *this,SampleArguments *args,Vec4 *result,ostream *report)

{
  ImgDim IVar1;
  bool bVar2;
  uint uVar3;
  SampleLookupSettings *pSVar4;
  Vector<float,_4> *this_00;
  int faceNdx;
  uint faceNdx_00;
  Vec4 coord;
  Vec4 dPdx;
  Vec4 dPdy;
  int in_stack_ffffffffffffff08;
  Vec2 *dPdyFace;
  undefined1 local_e8 [8];
  undefined1 auStack_e0 [8];
  ostream *local_d8;
  Vec4 *local_d0;
  Vec2 local_c8;
  Vec2 local_c0;
  Vec2 local_b8;
  Vector<float,_4> local_b0;
  Vector<float,_4> local_a0;
  Vec3 local_90;
  Vec3 local_80;
  Vec3 local_70;
  float local_60 [2];
  float afStack_58 [2];
  float local_50 [2];
  float afStack_48 [2];
  float local_40 [2];
  float afStack_38 [2];
  
  this_00 = (Vector<float,_4> *)local_e8;
  local_d8 = report;
  local_d0 = result;
  tcu::Vector<float,_4>::Vector(this_00,&args->coord);
  IVar1 = this->m_imParams->dim;
  if (IVar1 - IMG_DIM_3D < 2) {
    this_00 = (Vector<float,_4> *)(auStack_e0 + 4);
  }
  else if (IVar1 == IMG_DIM_1D) {
    this_00 = (Vector<float,_4> *)(local_e8 + 4);
  }
  else if (IVar1 == IMG_DIM_2D) {
    this_00 = (Vector<float,_4> *)auStack_e0;
  }
  pSVar4 = this->m_sampleLookupSettings;
  if (pSVar4->isProjective == true) {
    tcu::operator/((tcu *)&local_b0,(Vector<float,_4> *)local_e8,this_00->m_data[0]);
    auStack_e0._0_4_ = local_b0.m_data[2];
    local_e8._0_4_ = local_b0.m_data[0];
    local_e8._4_4_ = local_b0.m_data[1];
    pSVar4 = this->m_sampleLookupSettings;
  }
  if (pSVar4->lookupLodMode == LOOKUP_LOD_MODE_DERIVATIVES) {
    tcu::Vector<float,_4>::Vector(&local_b0,&args->dPdx);
  }
  else {
    tcu::Vector<float,_4>::Vector(&local_b0,0.0);
  }
  if (this->m_sampleLookupSettings->lookupLodMode == LOOKUP_LOD_MODE_DERIVATIVES) {
    tcu::Vector<float,_4>::Vector(&local_a0,&args->dPdy);
  }
  else {
    tcu::Vector<float,_4>::Vector(&local_a0,0.0);
  }
  if (this->m_imParams->dim == IMG_DIM_CUBE) {
    local_70.m_data[0] = (float)local_e8._0_4_;
    local_70.m_data[1] = (float)local_e8._4_4_;
    local_70.m_data[2] = (float)auStack_e0._0_4_;
    local_80.m_data[0] = local_b0.m_data[0];
    local_80.m_data[1] = local_b0.m_data[1];
    local_80.m_data[2] = local_b0.m_data[2];
    local_90.m_data[0] = local_a0.m_data[0];
    local_90.m_data[1] = local_a0.m_data[1];
    local_90.m_data[2] = local_a0.m_data[2];
    uVar3 = util::calcCandidateCubemapFaces(&local_70);
    for (faceNdx_00 = 0; faceNdx_00 != 6; faceNdx_00 = faceNdx_00 + 1) {
      if ((uVar3 >> (faceNdx_00 & 0x1f) & 1) != 0) {
        local_b8.m_data[0] = 0.0;
        local_b8.m_data[1] = 0.0;
        local_c0.m_data[0] = 0.0;
        local_c0.m_data[1] = 0.0;
        local_c8.m_data[0] = 0.0;
        local_c8.m_data[1] = 0.0;
        dPdyFace = &local_c8;
        util::calcCubemapFaceCoords
                  (&local_70,&local_80,&local_90,faceNdx_00,&local_b8,&local_c0,dPdyFace);
        local_40[0] = local_b8.m_data[0];
        local_40[1] = local_b8.m_data[1];
        afStack_38[0] = 0.0;
        afStack_38[1] = 0.0;
        local_50[0] = local_c0.m_data[0];
        local_50[1] = local_c0.m_data[1];
        afStack_48[0] = 0.0;
        afStack_48[1] = 0.0;
        local_60[0] = local_c8.m_data[0];
        local_60[1] = local_c8.m_data[1];
        afStack_58[0] = 0.0;
        afStack_58[1] = 0.0;
        bVar2 = verifySampleCubemapFace
                          (this,args,local_d0,(Vec4 *)local_40,(Vec4 *)local_50,(Vec4 *)local_60,
                           (int)dPdyFace,local_d8);
        if (bVar2) break;
      }
    }
    bVar2 = faceNdx_00 < 6;
  }
  else {
    bVar2 = verifySampleCubemapFace
                      (this,args,local_d0,(Vec4 *)local_e8,&local_b0,&local_a0,
                       in_stack_ffffffffffffff08,local_d8);
  }
  return bVar2;
}

Assistant:

bool SampleVerifier::verifySampleImpl (const SampleArguments&	args,
									   const Vec4&				result,
									   std::ostream&			report) const
{
	// \todo [2016-07-11 collinbaker] Handle depth and stencil formats
	// \todo [2016-07-06 collinbaker] Handle dRef
	DE_ASSERT(m_samplerParams.isCompare == false);

	Vec4	coord	  = args.coord;
	int coordSize = 0;

	if (m_imParams.dim == IMG_DIM_1D)
	{
		coordSize = 1;
	}
	else if (m_imParams.dim == IMG_DIM_2D)
	{
		coordSize = 2;
	}
	else if (m_imParams.dim == IMG_DIM_3D || m_imParams.dim == IMG_DIM_CUBE)
	{
		coordSize = 3;
	}

	// 15.6.1 Project operation

	if (m_sampleLookupSettings.isProjective)
	{
		DE_ASSERT(args.coord[coordSize] != 0.0f);
		const float proj = coord[coordSize];

		coord = coord / proj;
	}

	const Vec4 dPdx = (m_sampleLookupSettings.lookupLodMode == LOOKUP_LOD_MODE_DERIVATIVES) ? args.dPdx : Vec4(0);
	const Vec4 dPdy = (m_sampleLookupSettings.lookupLodMode == LOOKUP_LOD_MODE_DERIVATIVES) ? args.dPdy : Vec4(0);

	// 15.6.3 Cube Map Face Selection and Transformations

	if (m_imParams.dim == IMG_DIM_CUBE)
	{
		const Vec3	r		   = coord.swizzle(0, 1, 2);
		const Vec3	drdx	   = dPdx.swizzle(0, 1, 2);
		const Vec3	drdy	   = dPdy.swizzle(0, 1, 2);

	    int			faceBitmap = calcCandidateCubemapFaces(r);

		// We must test every possible disambiguation order

		for (int faceNdx = 0; faceNdx < 6; ++faceNdx)
		{
			const bool isPossible = ((faceBitmap & (1U << faceNdx)) != 0);

		    if (!isPossible)
			{
				continue;
			}

			Vec2 coordFace;
			Vec2 dPdxFace;
			Vec2 dPdyFace;

			calcCubemapFaceCoords(r, drdx, drdy, faceNdx, coordFace, dPdxFace, dPdyFace);

			if (verifySampleCubemapFace(args,
										result,
										Vec4(coordFace[0], coordFace[1], 0.0f, 0.0f),
										Vec4(dPdxFace[0], dPdxFace[1], 0.0f, 0.0f),
										Vec4(dPdyFace[0], dPdyFace[1], 0.0f, 0.0f),
										faceNdx,
										report))
			{
				return true;
			}
		}

		return false;
	}
	else
	{
		return verifySampleCubemapFace(args, result, coord, dPdx, dPdy, 0, report);
	}
}